

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

int rgbcx::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ulong extraout_RAX;
  ulong uVar2;
  uint32_t index_1;
  hist3 h_1;
  uint32_t i_3;
  uint32_t index;
  hist4 h;
  uint32_t i_2;
  int i_1;
  uint8_t bc1_expand6 [64];
  int i;
  uint8_t bc1_expand5 [32];
  hist3 local_8f;
  uint local_8c;
  uint local_88;
  hist4 local_84;
  uint local_80;
  int local_7c;
  float *in_stack_ffffffffffffff88;
  bc1_approx_mode in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  float *in_stack_ffffffffffffff98;
  bc1_match_entry *in_stack_ffffffffffffffa0;
  int local_2c;
  byte local_28 [36];
  undefined4 local_4;
  
  g_bc1_approx_mode = SUB84(ctx,0);
  for (local_2c = 0; local_2c < 0x20; local_2c = local_2c + 1) {
    local_28[local_2c] = (byte)(local_2c << 3) | (byte)(local_2c >> 2);
  }
  local_4 = g_bc1_approx_mode;
  prepare_bc1_single_color_table
            (in_stack_ffffffffffffffa0,(uint8_t *)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
  prepare_bc1_single_color_table_half
            (in_stack_ffffffffffffffa0,(uint8_t *)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
  for (local_7c = 0; local_7c < 0x40; local_7c = local_7c + 1) {
    (&stack0xffffffffffffff88)[local_7c] = (byte)(local_7c << 2) | (byte)(local_7c >> 4);
  }
  prepare_bc1_single_color_table
            (in_stack_ffffffffffffffa0,(uint8_t *)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
  prepare_bc1_single_color_table_half
            (in_stack_ffffffffffffffa0,(uint8_t *)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
  local_80 = 0;
  uVar2 = extraout_RAX;
  while (local_80 < 0x3c9) {
    hist4::hist4((hist4 *)0x12c89d);
    local_84.m_hist[0] = g_unique_total_orders4[(ulong)local_80 * 4];
    local_84.m_hist[1] = g_unique_total_orders4[(ulong)local_80 * 4 + 1];
    local_84.m_hist[2] = g_unique_total_orders4[(ulong)local_80 * 4 + 2];
    local_84.m_hist[3] = g_unique_total_orders4[(ulong)local_80 * 4 + 3];
    bVar1 = hist4::any_16(&local_84);
    if (!bVar1) {
      local_88 = (uint)local_84.m_hist[0] | (uint)local_84.m_hist[1] << 4 |
                 (uint)local_84.m_hist[2] << 8;
      *(short *)(g_total_ordering4_hash + (ulong)local_88 * 2) = (short)local_80;
    }
    compute_selector_factors4
              ((hist4 *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (float *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    local_80 = local_80 + 1;
    uVar2 = (ulong)local_80;
  }
  local_8c = 0;
  while (local_8c < 0x99) {
    hist3::hist3((hist3 *)0x12c9ab);
    local_8f.m_hist[0] = g_unique_total_orders3[(ulong)local_8c * 3];
    local_8f.m_hist[1] = g_unique_total_orders3[(ulong)local_8c * 3 + 1];
    local_8f.m_hist[2] = g_unique_total_orders3[(ulong)local_8c * 3 + 2];
    bVar1 = hist3::any_16(&local_8f);
    if (!bVar1) {
      *(short *)(g_total_ordering3_hash +
                (ulong)((uint)local_8f.m_hist[0] | (uint)local_8f.m_hist[1] << 4) * 2) =
           (short)local_8c;
    }
    compute_selector_factors3
              ((hist3 *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (float *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    local_8c = local_8c + 1;
    uVar2 = (ulong)local_8c;
  }
  g_initialized = 1;
  return (int)uVar2;
}

Assistant:

void init(bc1_approx_mode mode)
	{
		g_bc1_approx_mode = mode;
								
		uint8_t bc1_expand5[32];
		for (int i = 0; i < 32; i++)
			bc1_expand5[i] = static_cast<uint8_t>((i << 3) | (i >> 2));
		prepare_bc1_single_color_table(g_bc1_match5_equals_1, bc1_expand5, 32, mode);
		prepare_bc1_single_color_table_half(g_bc1_match5_half, bc1_expand5, 32, mode);

		uint8_t bc1_expand6[64];
		for (int i = 0; i < 64; i++)
			bc1_expand6[i] = static_cast<uint8_t>((i << 2) | (i >> 4));
		prepare_bc1_single_color_table(g_bc1_match6_equals_1, bc1_expand6, 64, mode);
		prepare_bc1_single_color_table_half(g_bc1_match6_half, bc1_expand6, 64, mode);

		for (uint32_t i = 0; i < NUM_UNIQUE_TOTAL_ORDERINGS4; i++)
		{
			hist4 h;
			h.m_hist[0] = (uint8_t)g_unique_total_orders4[i][0];
			h.m_hist[1] = (uint8_t)g_unique_total_orders4[i][1];
			h.m_hist[2] = (uint8_t)g_unique_total_orders4[i][2];
			h.m_hist[3] = (uint8_t)g_unique_total_orders4[i][3];
			
			if (!h.any_16())
			{
				const uint32_t index = h.m_hist[0] | (h.m_hist[1] << 4) | (h.m_hist[2] << 8);
				assert(index < 4096);
				g_total_ordering4_hash[index] = (uint16_t)i;
			}

			compute_selector_factors4(h, g_selector_factors4[i][0], g_selector_factors4[i][1], g_selector_factors4[i][2]);
		}

		for (uint32_t i = 0; i < NUM_UNIQUE_TOTAL_ORDERINGS3; i++)
		{
			hist3 h;
			h.m_hist[0] = (uint8_t)g_unique_total_orders3[i][0];
			h.m_hist[1] = (uint8_t)g_unique_total_orders3[i][1];
			h.m_hist[2] = (uint8_t)g_unique_total_orders3[i][2];
			
			if (!h.any_16())
			{
				const uint32_t index = h.m_hist[0] | (h.m_hist[1] << 4);
				assert(index < 256);
				g_total_ordering3_hash[index] = (uint16_t)i;
			}

			compute_selector_factors3(h, g_selector_factors3[i][0], g_selector_factors3[i][1], g_selector_factors3[i][2]);
		}

		g_initialized = true;
	}